

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O1

bool Kumu::GetXMLDocType(byte_t *buf,ui32_t buf_len,string *ns_prefix,string *type_name,
                        string *namespace_name,AttributeList *doc_attr_list)

{
  ILogSink *this;
  XMLElement tmp_element;
  XMLElement XStack_88;
  
  XMLElement::XMLElement(&XStack_88,"tmp");
  this = DefaultLogSink();
  ILogSink::Error(this,"Kumu compiled without XML parser support.\n");
  XMLElement::~XMLElement(&XStack_88);
  return false;
}

Assistant:

bool
Kumu::GetXMLDocType(const byte_t* buf, ui32_t buf_len, std::string& ns_prefix, std::string& type_name, std::string& namespace_name,
		    AttributeList& doc_attr_list)
{
  XMLElement tmp_element("tmp");

  if ( ! tmp_element.ParseFirstFromString((const char*)buf, buf_len) )
    {
      return false;
    }

  const XMLNamespace* ns = tmp_element.Namespace();

  if ( ns != 0 )
    {
      ns_prefix = ns->Prefix();
      namespace_name = ns->Name();
    }

  type_name = tmp_element.GetName();
  doc_attr_list = tmp_element.GetAttributes();
  return true;
}